

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O1

regexp_flag __thiscall mjs::regexp_flags_from_string(mjs *this,wstring_view s)

{
  uint uVar1;
  regexp_flag rVar2;
  regexp_flag rVar3;
  ostream *poVar4;
  runtime_error *this_00;
  long lVar5;
  byte bVar6;
  char *pcVar7;
  ostringstream oss;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  if (this == (mjs *)0x0) {
    rVar3 = none;
  }
  else {
    lVar5 = 0;
    rVar3 = none;
    do {
      uVar1 = *(uint *)(s._M_len + lVar5);
      if (SUB41(uVar1,0) == (string)0x67) {
        rVar2 = global;
LAB_00183fc9:
        bVar6 = 0;
      }
      else {
        if ((uVar1 & 0xff) == 0x6d) {
          rVar2 = multiline;
          goto LAB_00183fc9;
        }
        if ((uVar1 & 0xff) == 0x69) {
          rVar2 = ignore_case;
          goto LAB_00183fc9;
        }
        rVar2 = none;
        bVar6 = 1;
      }
      if ((bVar6 != 0) || ((rVar2 & rVar3) != none)) {
        std::__cxx11::ostringstream::ostringstream(local_190);
        if ((uVar1 & 0xff80) != 0) {
          __assert_fail("static_cast<char16_t>(ch) <= 0x7f",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/regexp.cpp"
                        ,0x28,"regexp_flag mjs::regexp_flags_from_string(std::wstring_view)");
        }
        pcVar7 = "Duplicate";
        if (bVar6 != 0) {
          pcVar7 = "Invalid";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_190,pcVar7,(ulong)(bVar6 ^ 1) * 2 + 7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," flag \'",7);
        local_1b0[0] = SUB41(uVar1,0);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_190,(char *)local_1b0,1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,"\' given to RegExp constructor",0x1d);
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,local_1b0);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      rVar3 = rVar2 | rVar3;
      lVar5 = lVar5 + 4;
    } while ((long)this * 4 != lVar5);
  }
  return rVar3;
}

Assistant:

regexp_flag regexp_flags_from_string(std::wstring_view s) {
    auto f = regexp_flag::none;
    for (const auto ch: s) {
        const regexp_flag here = regexp_flag_from_char(static_cast<char>(ch));
        if (here == regexp_flag::none || (f & here) != regexp_flag::none) {
            std::ostringstream oss;
            assert(static_cast<char16_t>(ch) <= 0x7f); // TODO: Report better...
            oss << (here == regexp_flag::none ? "Invalid" : "Duplicate") << " flag '" << static_cast<char>(ch) << "' given to RegExp constructor";
            throw std::runtime_error(oss.str());
        }
        f = f | here;
    }
    return f;
}